

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::ExtensionRangeOptions_Declaration::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  _func_int **pp_Var2;
  Arena *pAVar3;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *value;
  MessageLite *this;
  
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    pAVar3 = extraout_RDX;
LAB_001a5216:
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
LAB_001a5186:
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,value,pAVar3);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 0x1f) == 0) goto LAB_001a51d6;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[1]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      this = (MessageLite *)&to_msg[1]._internal_metadata_;
      pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar3 & 1) != 0) goto LAB_001a5216;
      goto LAB_001a5186;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pp_Var2 = from_msg[2]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 2),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar3
              );
  }
  if ((unaff_EBP & 4) != 0) {
    *(int *)&to_msg[2]._internal_metadata_.ptr_ = (int)from_msg[2]._internal_metadata_.ptr_;
  }
  if ((unaff_EBP & 8) != 0) {
    *(undefined1 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 4) =
         *(undefined1 *)((long)&from_msg[2]._internal_metadata_.ptr_ + 4);
  }
  if ((unaff_EBP & 0x10) != 0) {
    *(undefined1 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 5) =
         *(undefined1 *)((long)&from_msg[2]._internal_metadata_.ptr_ + 5);
  }
LAB_001a51d6:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void ExtensionRangeOptions_Declaration::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ExtensionRangeOptions_Declaration*>(&to_msg);
  auto& from = static_cast<const ExtensionRangeOptions_Declaration&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ExtensionRangeOptions.Declaration)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_full_name(from._internal_full_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_type(from._internal_type());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.number_ = from._impl_.number_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.reserved_ = from._impl_.reserved_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.repeated_ = from._impl_.repeated_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}